

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O2

void __thiscall Liby::WeakTimerHolder::WeakTimerHolder(WeakTimerHolder *this,TimerHolder *holder)

{
  uint64_t uVar1;
  __suseconds_t _Var2;
  Timer *pTVar3;
  undefined1 local_38 [16];
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  pTVar3 = TimerHolder::getTimer(holder);
  uVar1 = pTVar3->id_;
  pTVar3 = TimerHolder::getTimer(holder);
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = (_Invoker_type)0x0;
  local_38._0_8_ = (void *)0x0;
  local_38._8_8_ = 0;
  (this->timer_).id_ = uVar1;
  _Var2 = (pTVar3->timeout_).tv_.tv_usec;
  (this->timer_).timeout_.tv_.tv_sec = (pTVar3->timeout_).tv_.tv_sec;
  (this->timer_).timeout_.tv_.tv_usec = _Var2;
  std::function<void_()>::function(&(this->timer_).handler_,(function<void_()> *)local_38);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             (__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)holder);
  std::__weak_ptr<Liby::Timer,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<Liby::Timer,void>
            ((__weak_ptr<Liby::Timer,(__gnu_cxx::_Lock_policy)2> *)&this->weakTimerPtr_,
             (__shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

WeakTimerHolder(const TimerHolder &holder)
        : timer_(holder.getTimer().id(), holder.getTimer().timeout(), nullptr),
          weakTimerPtr_(holder.getTimerPtr()) {}